

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O3

void test_qpixl_frqi_compressedFRQICircuit<float>(void)

{
  float *pfVar1;
  vector<float,_std::allocator<float>_> *a_00;
  vector<float,_std::allocator<float>_> *a_01;
  vector<float,_std::allocator<float>_> *a_02;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  vector<float,_std::allocator<float>_> c;
  vector<float,_std::allocator<float>_> b;
  QCircuit<float,_qclab::QObject<float>_> circC;
  QCircuit<float,_qclab::QObject<float>_> circB;
  vector<float,_std::allocator<float>_> a;
  QCircuit<float,_qclab::QObject<float>_> circA;
  SquareMatrix<float> local_128;
  SquareMatrix<float> local_118;
  SquareMatrix<float> local_108;
  undefined1 local_f8 [16];
  vector<float,_std::allocator<float>_> local_e8;
  vector<float,_std::allocator<float>_> local_d0;
  undefined1 local_b8 [8];
  __uniq_ptr_impl<float,_std::default_delete<float[]>_> _Stack_b0;
  undefined8 local_a8;
  vector<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>_>_>
  vStack_a0;
  undefined1 local_88 [8];
  __uniq_ptr_impl<float,_std::default_delete<float[]>_> _Stack_80;
  vector<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>_>_>
  local_70;
  void *local_50 [2];
  long local_40;
  QCircuit<float,_qclab::QObject<float>_> local_38;
  
  local_38.super_QObject<float>._vptr_QObject = (_func_int **)0x3f8000003f000000;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_38;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_50,__l,(allocator_type *)local_88);
  qpixl::frqi::compressedFRQICircuit<std::vector<float,std::allocator<float>>>
            (&local_38,(frqi *)local_50,a_00,0.0);
  local_108.size_ = 4;
  local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(0x40);
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0) = 0.62054455;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 4) = 0.33900505;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) = 0.38205144;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc) = 0.59500986;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10) = -0.33900505;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x14) = 0.62054455;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x18) = -0.59500986;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x1c) = 0.38205144;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20) = 0.62054455;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x24) = 0.33900505;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x28) = -0.38205144;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x2c) = -0.59500986;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30) = -0.33900505;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x34) = 0.62054455;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x38) = 0.59500986;
  *(float *)((long)local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x3c) = -0.38205144;
  qclab::QCircuit<float,_qclab::QObject<float>_>::matrix
            ((QCircuit<float,_qclab::QObject<float>_> *)local_88);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<float>,qclab::dense::SquareMatrix<float>,float>
            ((SquareMatrix<float> *)local_88,&local_108,1.1920929e-06);
  if (_Stack_80._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)_Stack_80._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  local_88 = (undefined1  [8])0x3f8000003f000000;
  _Stack_80._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (tuple<float_*,_std::default_delete<float[]>_>)
       (_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)0x400000003fc00000;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)local_88;
  std::vector<float,_std::allocator<float>_>::vector(&local_d0,__l_00,(allocator_type *)local_b8);
  qpixl::frqi::compressedFRQICircuit<std::vector<float,std::allocator<float>>>
            ((QCircuit<float,_qclab::QObject<float>_> *)local_88,(frqi *)&local_d0,a_01,0.0);
  local_118.size_ = 8;
  local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(0x100);
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0) = 0.43879128;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 4) = 0.23971277;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) = 0.27015114;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc) = 0.42073548;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10) = 0.0353686;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x14) = 0.4987475;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x18) = -0.20807342;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x1c) = 0.4546487;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20) = -0.23971277;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x24) = 0.43879128;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x28) = -0.42073548;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x2c) = 0.27015114;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30) = -0.4987475;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x34) = 0.0353686;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x38) = -0.4546487;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x3c) = -0.20807342;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x40) = 0.43879128;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x44) = 0.23971277;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x48) = -0.27015114;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x4c) = -0.42073548;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x50) = 0.0353686;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x54) = 0.4987475;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x58) = 0.20807342;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x5c) = -0.4546487;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x60) = -0.23971277;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 100) = 0.43879128;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x68) = 0.42073548;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x6c) = -0.27015114;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x70) = -0.4987475;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x74) = 0.0353686;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x78) = 0.4546487;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x7c) = 0.20807342;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x80) = 0.43879128;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x84) = 0.23971277;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x88) = 0.27015114;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x8c) = 0.42073548;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x90) = -0.0353686;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x94) = -0.4987475;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x98) = 0.20807342;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x9c) = -0.4546487;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xa0) = -0.23971277;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xa4) = 0.43879128;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xa8) = -0.42073548;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xac) = 0.27015114;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xb0) = 0.4987475;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xb4) = -0.0353686;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xb8) = 0.4546487;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xbc) = 0.20807342;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc0) = 0.43879128;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc4) = 0.23971277;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 200) = -0.27015114;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xcc) = -0.42073548;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xd0) = -0.0353686;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xd4) = -0.4987475;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xd8) = -0.20807342;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xdc) = 0.4546487;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xe0) = -0.23971277;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xe4) = 0.43879128;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xe8) = 0.42073548;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xec) = -0.27015114;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xf0) = 0.4987475;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xf4) = -0.0353686;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xf8) = -0.4546487;
  *(float *)((long)local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xfc) = -0.20807342;
  qclab::QCircuit<float,_qclab::QObject<float>_>::matrix
            ((QCircuit<float,_qclab::QObject<float>_> *)local_b8);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<float>,qclab::dense::SquareMatrix<float>,float>
            ((SquareMatrix<float> *)local_b8,&local_118,1.1920929e-06);
  if ((__uniq_ptr_impl<float,_std::default_delete<float[]>_>)
      _Stack_b0._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)_Stack_b0._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  local_a8._0_4_ = 0x40200000;
  local_a8._4_4_ = 0x40400000;
  vStack_a0.
  super__Vector_base<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4080000040600000;
  local_b8 = (undefined1  [8])0x3f8000003f000000;
  _Stack_b0._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (tuple<float_*,_std::default_delete<float[]>_>)
       (_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)0x400000003fc00000;
  __l_01._M_len = 8;
  __l_01._M_array = (iterator)local_b8;
  std::vector<float,_std::allocator<float>_>::vector(&local_e8,__l_01,(allocator_type *)&local_128);
  qpixl::frqi::compressedFRQICircuit<std::vector<float,std::allocator<float>>>
            ((QCircuit<float,_qclab::QObject<float>_> *)local_b8,(frqi *)&local_e8,a_02,0.0);
  local_128.size_ = 0x10;
  local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(0x400);
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0) = 0.31027228;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 4) = 0.16950253;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 8) = 0.19102572;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc) = 0.29750493;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10) = 0.025009377;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x14) = 0.35266775;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x18) = -0.14713013;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x1c) = 0.3214852;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20) = -0.28324705;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x24) = 0.21159185;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x28) = -0.3500152;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x2c) = 0.049893457;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30) = -0.33108744;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x34) = -0.1240206;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x38) = -0.23109792;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x3c) = -0.26757008;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x40) = -0.16950253;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x44) = 0.31027228;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x48) = -0.29750493;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x4c) = 0.19102572;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x50) = -0.35266775;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x54) = 0.025009377;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x58) = -0.3214852;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x5c) = -0.14713013;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x60) = -0.21159185;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 100) = -0.28324705;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x68) = -0.049893457;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x6c) = -0.3500152;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x70) = 0.1240206;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x74) = -0.33108744;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x78) = 0.26757008;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x7c) = -0.23109792;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x80) = 0.31027228;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x84) = 0.16950253;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x88) = -0.19102572;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x8c) = -0.29750493;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x90) = 0.025009377;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x94) = 0.35266775;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x98) = 0.14713013;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x9c) = -0.3214852;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xa0) = -0.28324705;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xa4) = 0.21159185;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xa8) = 0.3500152;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xac) = -0.049893457;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xb0) = -0.33108744;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xb4) = -0.1240206;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xb8) = 0.23109792;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xbc) = 0.26757008;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc0) = -0.16950253;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc4) = 0.31027228;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 200) = 0.29750493;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xcc) = -0.19102572;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xd0) = -0.35266775;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xd4) = 0.025009377;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xd8) = 0.3214852;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xdc) = 0.14713013;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xe0) = -0.21159185;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xe4) = -0.28324705;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xe8) = 0.049893457;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xec) = 0.3500152;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xf0) = 0.1240206;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xf4) = -0.33108744;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xf8) = -0.26757008;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xfc) = 0.23109792;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x100) = 0.31027228;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x104) = 0.16950253;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x108) = 0.19102572;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10c) = 0.29750493;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x110) = -0.025009377;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x114) = -0.35266775;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x118) = 0.14713013;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x11c) = -0.3214852;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x120) = -0.28324705;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x124) = 0.21159185;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x128) = -0.3500152;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 300) = 0.049893457;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x130) = 0.33108744;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x134) = 0.1240206;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x138) = 0.23109792;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x13c) = 0.26757008;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x140) = -0.16950253;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x144) = 0.31027228;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x148) = -0.29750493;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x14c) = 0.19102572;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x150) = 0.35266775;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x154) = -0.025009377;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x158) = 0.3214852;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x15c) = 0.14713013;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x160) = -0.21159185;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x164) = -0.28324705;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x168) = -0.049893457;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x16c) = -0.3500152;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x170) = -0.1240206;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x174) = 0.33108744;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x178) = -0.26757008;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x17c) = 0.23109792;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x180) = 0.31027228;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x184) = 0.16950253;
  ((float *)
  ((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + (local_128.size_ * 6 + 2) * 4))[0] =
       -0.19102572;
  ((float *)
  ((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + (local_128.size_ * 6 + 2) * 4))[1] =
       -0.29750493;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 6 + 4) * 4);
  pfVar1[0] = -0.025009377;
  pfVar1[1] = -0.35266775;
  pfVar1[2] = -0.14713013;
  pfVar1[3] = 0.3214852;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 6 + 8) * 4);
  pfVar1[0] = -0.28324705;
  pfVar1[1] = 0.21159185;
  pfVar1[2] = 0.3500152;
  pfVar1[3] = -0.049893457;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 6 + 0xc) * 4);
  pfVar1[0] = 0.33108744;
  pfVar1[1] = 0.1240206;
  pfVar1[2] = -0.23109792;
  pfVar1[3] = -0.26757008;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    local_128.size_ * 7 * 4);
  pfVar1[0] = -0.16950253;
  pfVar1[1] = 0.31027228;
  pfVar1[2] = 0.29750493;
  pfVar1[3] = -0.19102572;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 7 + 4) * 4);
  pfVar1[0] = 0.35266775;
  pfVar1[1] = -0.025009377;
  pfVar1[2] = -0.3214852;
  pfVar1[3] = -0.14713013;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 7 + 8) * 4);
  pfVar1[0] = -0.21159185;
  pfVar1[1] = -0.28324705;
  pfVar1[2] = 0.049893457;
  pfVar1[3] = 0.3500152;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 7 + 0xc) * 4);
  pfVar1[0] = -0.1240206;
  pfVar1[1] = 0.33108744;
  pfVar1[2] = 0.26757008;
  pfVar1[3] = -0.23109792;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    local_128.size_ * 8 * 4);
  pfVar1[0] = 0.31027228;
  pfVar1[1] = 0.16950253;
  pfVar1[2] = 0.19102572;
  pfVar1[3] = 0.29750493;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 8 + 4) * 4);
  pfVar1[0] = 0.025009377;
  pfVar1[1] = 0.35266775;
  pfVar1[2] = -0.14713013;
  pfVar1[3] = 0.3214852;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 8 + 8) * 4);
  pfVar1[0] = 0.28324705;
  pfVar1[1] = -0.21159185;
  pfVar1[2] = 0.3500152;
  pfVar1[3] = -0.049893457;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 8 + 0xc) * 4);
  pfVar1[0] = 0.33108744;
  pfVar1[1] = 0.1240206;
  pfVar1[2] = 0.23109792;
  pfVar1[3] = 0.26757008;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    local_128.size_ * 9 * 4);
  pfVar1[0] = -0.16950253;
  pfVar1[1] = 0.31027228;
  pfVar1[2] = -0.29750493;
  pfVar1[3] = 0.19102572;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 9 + 4) * 4);
  pfVar1[0] = -0.35266775;
  pfVar1[1] = 0.025009377;
  pfVar1[2] = -0.3214852;
  pfVar1[3] = -0.14713013;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 9 + 8) * 4);
  pfVar1[0] = 0.21159185;
  pfVar1[1] = 0.28324705;
  pfVar1[2] = 0.049893457;
  pfVar1[3] = 0.3500152;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 9 + 0xc) * 4);
  pfVar1[0] = -0.1240206;
  pfVar1[1] = 0.33108744;
  pfVar1[2] = -0.26757008;
  pfVar1[3] = 0.23109792;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    local_128.size_ * 10 * 4);
  pfVar1[0] = 0.31027228;
  pfVar1[1] = 0.16950253;
  pfVar1[2] = -0.19102572;
  pfVar1[3] = -0.29750493;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 10 + 4) * 4);
  pfVar1[0] = 0.025009377;
  pfVar1[1] = 0.35266775;
  pfVar1[2] = 0.14713013;
  pfVar1[3] = -0.3214852;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 10 + 8) * 4);
  pfVar1[0] = 0.28324705;
  pfVar1[1] = -0.21159185;
  pfVar1[2] = -0.3500152;
  pfVar1[3] = 0.049893457;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 10 + 0xc) * 4);
  pfVar1[0] = 0.33108744;
  pfVar1[1] = 0.1240206;
  pfVar1[2] = -0.23109792;
  pfVar1[3] = -0.26757008;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    local_128.size_ * 0xb * 4);
  pfVar1[0] = -0.16950253;
  pfVar1[1] = 0.31027228;
  pfVar1[2] = 0.29750493;
  pfVar1[3] = -0.19102572;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 0xb + 4) * 4);
  pfVar1[0] = -0.35266775;
  pfVar1[1] = 0.025009377;
  pfVar1[2] = 0.3214852;
  pfVar1[3] = 0.14713013;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 0xb + 8) * 4);
  pfVar1[0] = 0.21159185;
  pfVar1[1] = 0.28324705;
  pfVar1[2] = -0.049893457;
  pfVar1[3] = -0.3500152;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 0xb + 0xc) * 4);
  pfVar1[0] = -0.1240206;
  pfVar1[1] = 0.33108744;
  pfVar1[2] = 0.26757008;
  pfVar1[3] = -0.23109792;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    local_128.size_ * 0xc * 4);
  pfVar1[0] = 0.31027228;
  pfVar1[1] = 0.16950253;
  pfVar1[2] = 0.19102572;
  pfVar1[3] = 0.29750493;
  ((float *)
  ((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + (local_128.size_ * 0xc + 4) * 4))[0] =
       -0.025009377;
  ((float *)
  ((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + (local_128.size_ * 0xc + 4) * 4))[1] =
       -0.35266775;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl +
            (local_128.size_ * 0xc + 6) * 4) = 0.14713013;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 0xc + 7) * 4);
  pfVar1[0] = -0.3214852;
  pfVar1[1] = 0.28324705;
  pfVar1[2] = -0.21159185;
  pfVar1[3] = 0.3500152;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 0xc + 0xb) * 4);
  pfVar1[0] = -0.049893457;
  pfVar1[1] = -0.33108744;
  pfVar1[2] = -0.1240206;
  pfVar1[3] = -0.23109792;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl +
            (local_128.size_ * 0xc + 0xf) * 4) = -0.26757008;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    local_128.size_ * 0xd * 4);
  pfVar1[0] = -0.16950253;
  pfVar1[1] = 0.31027228;
  pfVar1[2] = -0.29750493;
  pfVar1[3] = 0.19102572;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 0xd + 4) * 4);
  pfVar1[0] = 0.35266775;
  pfVar1[1] = -0.025009377;
  pfVar1[2] = 0.3214852;
  pfVar1[3] = 0.14713013;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 0xd + 8) * 4);
  pfVar1[0] = 0.21159185;
  pfVar1[1] = 0.28324705;
  pfVar1[2] = 0.049893457;
  pfVar1[3] = 0.3500152;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 0xd + 0xc) * 4);
  pfVar1[0] = 0.1240206;
  pfVar1[1] = -0.33108744;
  pfVar1[2] = 0.26757008;
  pfVar1[3] = -0.23109792;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    local_128.size_ * 0xe * 4);
  pfVar1[0] = 0.31027228;
  pfVar1[1] = 0.16950253;
  pfVar1[2] = -0.19102572;
  pfVar1[3] = -0.29750493;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 0xe + 4) * 4);
  pfVar1[0] = -0.025009377;
  pfVar1[1] = -0.35266775;
  pfVar1[2] = -0.14713013;
  pfVar1[3] = 0.3214852;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 0xe + 8) * 4);
  pfVar1[0] = 0.28324705;
  pfVar1[1] = -0.21159185;
  pfVar1[2] = -0.3500152;
  pfVar1[3] = 0.049893457;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 0xe + 0xc) * 4);
  pfVar1[0] = -0.33108744;
  pfVar1[1] = -0.1240206;
  pfVar1[2] = 0.23109792;
  pfVar1[3] = 0.26757008;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    local_128.size_ * 0xf * 4);
  pfVar1[0] = -0.16950253;
  pfVar1[1] = 0.31027228;
  pfVar1[2] = 0.29750493;
  pfVar1[3] = -0.19102572;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl +
            (local_128.size_ * 0xf + 4) * 4) = 0.35266775;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 0xf + 5) * 4);
  pfVar1[0] = -0.025009377;
  pfVar1[1] = -0.3214852;
  pfVar1[2] = -0.14713013;
  pfVar1[3] = 0.21159185;
  pfVar1 = (float *)((long)local_128.data_._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl +
                    (local_128.size_ * 0xf + 9) * 4);
  pfVar1[0] = 0.28324705;
  pfVar1[1] = -0.049893457;
  pfVar1[2] = -0.3500152;
  pfVar1[3] = 0.1240206;
  ((float *)
  ((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + (local_128.size_ * 0xf + 0xd) * 4))[0]
       = -0.33108744;
  ((float *)
  ((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + (local_128.size_ * 0xf + 0xd) * 4))[1]
       = -0.26757008;
  *(float *)((long)local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl +
            (local_128.size_ * 0xf + 0xf) * 4) = 0.23109792;
  qclab::QCircuit<float,_qclab::QObject<float>_>::matrix
            ((QCircuit<float,_qclab::QObject<float>_> *)local_f8);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<float>,qclab::dense::SquareMatrix<float>,float>
            ((SquareMatrix<float> *)local_f8,&local_128,1.1920929e-06);
  if ((__uniq_ptr_impl<float,_std::default_delete<float[]>_>)local_f8._8_8_ !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)local_f8._8_8_);
  }
  if ((_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)
      local_128.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl != (float *)0x0) {
    operator_delete__((void *)local_128.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  local_b8 = (undefined1  [8])&PTR_nbQubits_0018b890;
  std::
  vector<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>_>_>
  ::~vector(&vStack_a0);
  if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_118.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)local_118.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  local_88 = (undefined1  [8])&PTR_nbQubits_0018b890;
  std::
  vector<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>_>_>
  ::~vector(&local_70);
  if ((pointer)local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_108.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)local_108.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  local_38.super_QObject<float>._vptr_QObject = (_func_int **)&PTR_nbQubits_0018b890;
  std::
  vector<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>_>_>
  ::~vector(&local_38.gates_);
  if (local_50[0] != (void *)0x0) {
    operator_delete(local_50[0],local_40 - (long)local_50[0]);
  }
  return;
}

Assistant:

void test_qpixl_frqi_compressedFRQICircuit() {
  const R eps = std::numeric_limits< R >::epsilon() ;

  std::vector< R > a = { 0.5 , 1 } ;

  auto circA = qpixl::frqi::compressedFRQICircuit( a ) ;

  // matrix
  qclab::dense::SquareMatrix< R > circA_check(    
  0.620544580563746, -0.339005049421045,  0.620544580563746, -0.339005049421045,
  0.339005049421045,  0.620544580563746,  0.339005049421045,  0.620544580563746,
  0.382051424370090, -0.595009839529386, -0.382051424370090,  0.595009839529386,
  0.595009839529386,  0.382051424370090, -0.595009839529386, -0.382051424370090
  ) ;

  test_qpixl_frqi_check_matrix( circA.matrix() , circA_check  , 10*eps );
  
  
  std::vector< R > b = { 0.5 , 1 , 1.5 , 2 };

  auto circB = qpixl::frqi::compressedFRQICircuit( b ) ;

  // matrix
  qclab::dense::SquareMatrix< R > circB_check( 8 ) ;

  circB_check( 0, 0 ) =  0.438791280945186 ;
  circB_check( 1, 0 ) =  0.239712769302101 ;
  circB_check( 2, 0 ) =  0.270151152934070 ;
  circB_check( 3, 0 ) =  0.420735492403948 ;
  circB_check( 4, 0 ) =  0.035368600833851 ;
  circB_check( 5, 0 ) =  0.498747493302027 ;
  circB_check( 6, 0 ) = -0.208073418273571 ;
  circB_check( 7, 0 ) =  0.454648713412841 ;

  circB_check( 0, 1 ) = -0.239712769302101 ;
  circB_check( 1, 1 ) =  0.438791280945186 ;
  circB_check( 2, 1 ) = -0.420735492403948 ;
  circB_check( 3, 1 ) =  0.270151152934070 ;
  circB_check( 4, 1 ) = -0.498747493302027 ;
  circB_check( 5, 1 ) =  0.035368600833851 ;
  circB_check( 6, 1 ) = -0.454648713412841 ;
  circB_check( 7, 1 ) = -0.208073418273571 ;

  circB_check( 0, 2 ) =  0.438791280945186 ;
  circB_check( 1, 2 ) =  0.239712769302101 ;
  circB_check( 2, 2 ) = -0.270151152934070 ;
  circB_check( 3, 2 ) = -0.420735492403948 ;
  circB_check( 4, 2 ) =  0.035368600833851 ;
  circB_check( 5, 2 ) =  0.498747493302027 ;
  circB_check( 6, 2 ) =  0.208073418273571 ;
  circB_check( 7, 2 ) = -0.454648713412841 ;

  circB_check( 0, 3 ) = -0.239712769302101 ;
  circB_check( 1, 3 ) =  0.438791280945186 ;
  circB_check( 2, 3 ) =  0.420735492403948 ;
  circB_check( 3, 3 ) = -0.270151152934070 ;
  circB_check( 4, 3 ) = -0.498747493302027 ;
  circB_check( 5, 3 ) =  0.035368600833851 ;
  circB_check( 6, 3 ) =  0.454648713412841 ;
  circB_check( 7, 3 ) =  0.208073418273571 ;

  circB_check( 0, 4 ) =  0.438791280945186 ;
  circB_check( 1, 4 ) =  0.239712769302101 ;
  circB_check( 2, 4 ) =  0.270151152934070 ;
  circB_check( 3, 4 ) =  0.420735492403948 ;
  circB_check( 4, 4 ) = -0.035368600833851 ;
  circB_check( 5, 4 ) = -0.498747493302027 ;
  circB_check( 6, 4 ) =  0.208073418273571 ;
  circB_check( 7, 4 ) = -0.454648713412841 ;

  circB_check( 0, 5 ) = -0.239712769302101 ;
  circB_check( 1, 5 ) =  0.438791280945186 ;
  circB_check( 2, 5 ) = -0.420735492403948 ;
  circB_check( 3, 5 ) =  0.270151152934070 ;
  circB_check( 4, 5 ) =  0.498747493302027 ;
  circB_check( 5, 5 ) = -0.035368600833851 ;
  circB_check( 6, 5 ) =  0.454648713412841 ;
  circB_check( 7, 5 ) =  0.208073418273571 ;

  circB_check( 0, 6 ) =  0.438791280945186 ;
  circB_check( 1, 6 ) =  0.239712769302101 ;
  circB_check( 2, 6 ) = -0.270151152934070 ;
  circB_check( 3, 6 ) = -0.420735492403948 ;
  circB_check( 4, 6 ) = -0.035368600833851 ;
  circB_check( 5, 6 ) = -0.498747493302027 ;
  circB_check( 6, 6 ) = -0.208073418273571 ;
  circB_check( 7, 6 ) =  0.454648713412841 ;

  circB_check( 0, 7 ) = -0.239712769302101 ;
  circB_check( 1, 7 ) =  0.438791280945186 ;
  circB_check( 2, 7 ) =  0.420735492403948 ;
  circB_check( 3, 7 ) = -0.270151152934070 ;
  circB_check( 4, 7 ) =  0.498747493302027 ;
  circB_check( 5, 7 ) = -0.035368600833851 ;
  circB_check( 6, 7 ) = -0.454648713412841 ;
  circB_check( 7, 7 ) = -0.208073418273571 ;


  test_qpixl_frqi_check_matrix( circB.matrix() , circB_check  , 10*eps );



  std::vector< R > c = { 0.5 , 1 , 1.5 , 2 , 2.5 , 3 , 3.5 , 4 };

  auto circC = qpixl::frqi::compressedFRQICircuit( c ) ;  

  // matrix
  qclab::dense::SquareMatrix< R > circC_check( 16 ) ;

  circC_check(  0, 0 ) =    0.310272290281873 ;
  circC_check(  1, 0 ) =    0.169502524710522 ;
  circC_check(  2, 0 ) =    0.191025712185045 ;
  circC_check(  3, 0 ) =    0.297504919764693 ;
  circC_check(  4, 0 ) =    0.025009377490697 ;
  circC_check(  5, 0 ) =    0.352667734613656 ;
  circC_check(  6, 0 ) =   -0.147130125045907 ;
  circC_check(  7, 0 ) =    0.321485188311959 ;
  circC_check(  8, 0 ) =   -0.283247041628773 ;
  circC_check(  9, 0 ) =    0.211591855723580 ;
  circC_check( 10, 0 ) =   -0.350015203834987 ;
  circC_check( 11, 0 ) =    0.049893457330116 ;
  circC_check( 12, 0 ) =   -0.331087436935406 ;
  circC_check( 13, 0 ) =   -0.124020599512917 ;
  circC_check( 14, 0 ) =   -0.231097918395994 ;
  circC_check( 15, 0 ) =   -0.267570088225568 ;

  circC_check(  0, 1 ) =   -0.169502524710522 ;
  circC_check(  1, 1 ) =    0.310272290281873 ;
  circC_check(  2, 1 ) =   -0.297504919764693 ;
  circC_check(  3, 1 ) =    0.191025712185045 ;
  circC_check(  4, 1 ) =   -0.352667734613656 ;
  circC_check(  5, 1 ) =    0.025009377490697 ;
  circC_check(  6, 1 ) =   -0.321485188311959 ;
  circC_check(  7, 1 ) =   -0.147130125045907 ;
  circC_check(  8, 1 ) =   -0.211591855723580 ;
  circC_check(  9, 1 ) =   -0.283247041628773 ;
  circC_check( 10, 1 ) =   -0.049893457330116 ;
  circC_check( 11, 1 ) =   -0.350015203834987 ;
  circC_check( 12, 1 ) =    0.124020599512917 ;
  circC_check( 13, 1 ) =   -0.331087436935406 ;
  circC_check( 14, 1 ) =    0.267570088225568 ;
  circC_check( 15, 1 ) =   -0.231097918395994 ;

  circC_check(  0, 2 ) =    0.310272290281873 ;
  circC_check(  1, 2 ) =    0.169502524710522 ;
  circC_check(  2, 2 ) =   -0.191025712185045 ;
  circC_check(  3, 2 ) =   -0.297504919764693 ;
  circC_check(  4, 2 ) =    0.025009377490697 ;
  circC_check(  5, 2 ) =    0.352667734613656 ;
  circC_check(  6, 2 ) =    0.147130125045907 ;
  circC_check(  7, 2 ) =   -0.321485188311959 ;
  circC_check(  8, 2 ) =   -0.283247041628773 ;
  circC_check(  9, 2 ) =    0.211591855723580 ;
  circC_check( 10, 2 ) =    0.350015203834987 ;
  circC_check( 11, 2 ) =   -0.049893457330116 ;
  circC_check( 12, 2 ) =   -0.331087436935406 ;
  circC_check( 13, 2 ) =   -0.124020599512917 ;
  circC_check( 14, 2 ) =    0.231097918395994 ;
  circC_check( 15, 2 ) =    0.267570088225568 ;

  circC_check(  0, 3 ) =   -0.169502524710522 ;
  circC_check(  1, 3 ) =    0.310272290281873 ;
  circC_check(  2, 3 ) =    0.297504919764693 ;
  circC_check(  3, 3 ) =   -0.191025712185045 ;
  circC_check(  4, 3 ) =   -0.352667734613656 ;
  circC_check(  5, 3 ) =    0.025009377490697 ;
  circC_check(  6, 3 ) =    0.321485188311959 ;
  circC_check(  7, 3 ) =    0.147130125045907 ;
  circC_check(  8, 3 ) =   -0.211591855723580 ;
  circC_check(  9, 3 ) =   -0.283247041628773 ;
  circC_check( 10, 3 ) =    0.049893457330116 ;
  circC_check( 11, 3 ) =    0.350015203834987 ;
  circC_check( 12, 3 ) =    0.124020599512917 ;
  circC_check( 13, 3 ) =   -0.331087436935406 ;
  circC_check( 14, 3 ) =   -0.267570088225568 ;
  circC_check( 15, 3 ) =    0.231097918395994 ;

  circC_check(  0, 4 ) =    0.310272290281873 ;
  circC_check(  1, 4 ) =    0.169502524710522 ;
  circC_check(  2, 4 ) =    0.191025712185045 ;
  circC_check(  3, 4 ) =    0.297504919764693 ;
  circC_check(  4, 4 ) =   -0.025009377490697 ;
  circC_check(  5, 4 ) =   -0.352667734613656 ;
  circC_check(  6, 4 ) =    0.147130125045907 ;
  circC_check(  7, 4 ) =   -0.321485188311959 ;
  circC_check(  8, 4 ) =   -0.283247041628773 ;
  circC_check(  9, 4 ) =    0.211591855723580 ;
  circC_check( 10, 4 ) =   -0.350015203834987 ;
  circC_check( 11, 4 ) =    0.049893457330116 ;
  circC_check( 12, 4 ) =    0.331087436935406 ;
  circC_check( 13, 4 ) =    0.124020599512917 ;
  circC_check( 14, 4 ) =    0.231097918395994 ;
  circC_check( 15, 4 ) =    0.267570088225568 ;

  circC_check(  0, 5 ) =   -0.169502524710522 ;
  circC_check(  1, 5 ) =    0.310272290281873 ;
  circC_check(  2, 5 ) =   -0.297504919764693 ;
  circC_check(  3, 5 ) =    0.191025712185045 ;
  circC_check(  4, 5 ) =    0.352667734613656 ;
  circC_check(  5, 5 ) =   -0.025009377490697 ;
  circC_check(  6, 5 ) =    0.321485188311959 ;
  circC_check(  7, 5 ) =    0.147130125045907 ;
  circC_check(  8, 5 ) =   -0.211591855723580 ;
  circC_check(  9, 5 ) =   -0.283247041628773 ;
  circC_check( 10, 5 ) =   -0.049893457330116 ;
  circC_check( 11, 5 ) =   -0.350015203834987 ;
  circC_check( 12, 5 ) =   -0.124020599512917 ;
  circC_check( 13, 5 ) =    0.331087436935406 ;
  circC_check( 14, 5 ) =   -0.267570088225568 ;
  circC_check( 15, 5 ) =    0.231097918395994 ;

  circC_check(  0, 6 ) =    0.310272290281873 ;
  circC_check(  1, 6 ) =    0.169502524710522 ;
  circC_check(  2, 6 ) =   -0.191025712185045 ;
  circC_check(  3, 6 ) =   -0.297504919764693 ;
  circC_check(  4, 6 ) =   -0.025009377490697 ;
  circC_check(  5, 6 ) =   -0.352667734613656 ;
  circC_check(  6, 6 ) =   -0.147130125045907 ;
  circC_check(  7, 6 ) =    0.321485188311959 ;
  circC_check(  8, 6 ) =   -0.283247041628773 ;
  circC_check(  9, 6 ) =    0.211591855723580 ;
  circC_check( 10, 6 ) =    0.350015203834987 ;
  circC_check( 11, 6 ) =   -0.049893457330116 ;
  circC_check( 12, 6 ) =    0.331087436935406 ;
  circC_check( 13, 6 ) =    0.124020599512917 ;
  circC_check( 14, 6 ) =   -0.231097918395994 ;
  circC_check( 15, 6 ) =   -0.267570088225568 ;

  circC_check(  0, 7 ) =   -0.169502524710522 ;
  circC_check(  1, 7 ) =    0.310272290281873 ;
  circC_check(  2, 7 ) =    0.297504919764693 ;
  circC_check(  3, 7 ) =   -0.191025712185045 ;
  circC_check(  4, 7 ) =    0.352667734613656 ;
  circC_check(  5, 7 ) =   -0.025009377490697 ;
  circC_check(  6, 7 ) =   -0.321485188311959 ;
  circC_check(  7, 7 ) =   -0.147130125045907 ;
  circC_check(  8, 7 ) =   -0.211591855723580 ;
  circC_check(  9, 7 ) =   -0.283247041628773 ;
  circC_check( 10, 7 ) =    0.049893457330116 ;
  circC_check( 11, 7 ) =    0.350015203834987 ;
  circC_check( 12, 7 ) =   -0.124020599512917 ;
  circC_check( 13, 7 ) =    0.331087436935406 ;
  circC_check( 14, 7 ) =    0.267570088225568 ;
  circC_check( 15, 7 ) =   -0.231097918395994 ;

  circC_check(  0, 8 ) =    0.310272290281873 ;
  circC_check(  1, 8 ) =    0.169502524710522 ;
  circC_check(  2, 8 ) =    0.191025712185045 ;
  circC_check(  3, 8 ) =    0.297504919764693 ;
  circC_check(  4, 8 ) =    0.025009377490697 ;
  circC_check(  5, 8 ) =    0.352667734613656 ;
  circC_check(  6, 8 ) =   -0.147130125045907 ;
  circC_check(  7, 8 ) =    0.321485188311959 ;
  circC_check(  8, 8 ) =    0.283247041628773 ;
  circC_check(  9, 8 ) =   -0.211591855723580 ;
  circC_check( 10, 8 ) =    0.350015203834987 ;
  circC_check( 11, 8 ) =   -0.049893457330116 ;
  circC_check( 12, 8 ) =    0.331087436935406 ;
  circC_check( 13, 8 ) =    0.124020599512917 ;
  circC_check( 14, 8 ) =    0.231097918395994 ;
  circC_check( 15, 8 ) =    0.267570088225568 ;

  circC_check(  0, 9 ) =   -0.169502524710522 ;
  circC_check(  1, 9 ) =    0.310272290281873 ;
  circC_check(  2, 9 ) =   -0.297504919764693 ;
  circC_check(  3, 9 ) =    0.191025712185045 ;
  circC_check(  4, 9 ) =   -0.352667734613656 ;
  circC_check(  5, 9 ) =    0.025009377490697 ;
  circC_check(  6, 9 ) =   -0.321485188311959 ;
  circC_check(  7, 9 ) =   -0.147130125045907 ;
  circC_check(  8, 9 ) =    0.211591855723580 ;
  circC_check(  9, 9 ) =    0.283247041628773 ;
  circC_check( 10, 9 ) =    0.049893457330116 ;
  circC_check( 11, 9 ) =    0.350015203834987 ;
  circC_check( 12, 9 ) =   -0.124020599512917 ;
  circC_check( 13, 9 ) =    0.331087436935406 ;
  circC_check( 14, 9 ) =   -0.267570088225568 ;
  circC_check( 15, 9 ) =    0.231097918395994 ;

  circC_check(  0, 10 ) =    0.310272290281873 ;
  circC_check(  1, 10 ) =    0.169502524710522 ;
  circC_check(  2, 10 ) =   -0.191025712185045 ;
  circC_check(  3, 10 ) =   -0.297504919764693 ;
  circC_check(  4, 10 ) =    0.025009377490697 ;
  circC_check(  5, 10 ) =    0.352667734613656 ;
  circC_check(  6, 10 ) =    0.147130125045907 ;
  circC_check(  7, 10 ) =   -0.321485188311959 ;
  circC_check(  8, 10 ) =    0.283247041628773 ;
  circC_check(  9, 10 ) =   -0.211591855723580 ;
  circC_check( 10, 10 ) =   -0.350015203834987 ;
  circC_check( 11, 10 ) =    0.049893457330116 ;
  circC_check( 12, 10 ) =    0.331087436935406 ;
  circC_check( 13, 10 ) =    0.124020599512917 ;
  circC_check( 14, 10 ) =   -0.231097918395994 ;
  circC_check( 15, 10 ) =   -0.267570088225568 ;

  circC_check(  0, 11 ) =   -0.169502524710522 ;
  circC_check(  1, 11 ) =    0.310272290281873 ;
  circC_check(  2, 11 ) =    0.297504919764693 ;
  circC_check(  3, 11 ) =   -0.191025712185045 ;
  circC_check(  4, 11 ) =   -0.352667734613656 ;
  circC_check(  5, 11 ) =    0.025009377490697 ;
  circC_check(  6, 11 ) =    0.321485188311959 ;
  circC_check(  7, 11 ) =    0.147130125045907 ;
  circC_check(  8, 11 ) =    0.211591855723580 ;
  circC_check(  9, 11 ) =    0.283247041628773 ;
  circC_check( 10, 11 ) =   -0.049893457330116 ;
  circC_check( 11, 11 ) =   -0.350015203834987 ;
  circC_check( 12, 11 ) =   -0.124020599512917 ;
  circC_check( 13, 11 ) =    0.331087436935406 ;
  circC_check( 14, 11 ) =    0.267570088225568 ;
  circC_check( 15, 11 ) =   -0.231097918395994 ;

  circC_check(  0, 12 ) =    0.310272290281873 ;
  circC_check(  1, 12 ) =    0.169502524710522 ;
  circC_check(  2, 12 ) =    0.191025712185045 ;
  circC_check(  3, 12 ) =    0.297504919764693 ;
  circC_check(  4, 12 ) =   -0.025009377490697 ;
  circC_check(  5, 12 ) =   -0.352667734613656 ;
  circC_check(  6, 12 ) =    0.147130125045907 ;
  circC_check(  7, 12 ) =   -0.321485188311959 ;
  circC_check(  8, 12 ) =    0.283247041628773 ;
  circC_check(  9, 12 ) =   -0.211591855723580 ;
  circC_check( 10, 12 ) =    0.350015203834987 ;
  circC_check( 11, 12 ) =   -0.049893457330116 ;
  circC_check( 12, 12 ) =   -0.331087436935406 ;
  circC_check( 13, 12 ) =   -0.124020599512917 ;
  circC_check( 14, 12 ) =   -0.231097918395994 ;
  circC_check( 15, 12 ) =   -0.267570088225568 ;

  circC_check(  0, 13 ) =   -0.169502524710522 ;
  circC_check(  1, 13 ) =    0.310272290281873 ;
  circC_check(  2, 13 ) =   -0.297504919764693 ;
  circC_check(  3, 13 ) =    0.191025712185045 ;
  circC_check(  4, 13 ) =    0.352667734613656 ;
  circC_check(  5, 13 ) =   -0.025009377490697 ;
  circC_check(  6, 13 ) =    0.321485188311959 ;
  circC_check(  7, 13 ) =    0.147130125045907 ;
  circC_check(  8, 13 ) =    0.211591855723580 ;
  circC_check(  9, 13 ) =    0.283247041628773 ;
  circC_check( 10, 13 ) =    0.049893457330116 ;
  circC_check( 11, 13 ) =    0.350015203834987 ;
  circC_check( 12, 13 ) =    0.124020599512917 ;
  circC_check( 13, 13 ) =   -0.331087436935406 ;
  circC_check( 14, 13 ) =    0.267570088225568 ;
  circC_check( 15, 13 ) =   -0.231097918395994 ;

  circC_check(  0, 14 ) =    0.310272290281873 ;
  circC_check(  1, 14 ) =    0.169502524710522 ;
  circC_check(  2, 14 ) =   -0.191025712185045 ;
  circC_check(  3, 14 ) =   -0.297504919764693 ;
  circC_check(  4, 14 ) =   -0.025009377490697 ;
  circC_check(  5, 14 ) =   -0.352667734613656 ;
  circC_check(  6, 14 ) =   -0.147130125045907 ;
  circC_check(  7, 14 ) =    0.321485188311959 ;
  circC_check(  8, 14 ) =    0.283247041628773 ;
  circC_check(  9, 14 ) =   -0.211591855723580 ;
  circC_check( 10, 14 ) =   -0.350015203834987 ;
  circC_check( 11, 14 ) =    0.049893457330116 ;
  circC_check( 12, 14 ) =   -0.331087436935406 ;
  circC_check( 13, 14 ) =   -0.124020599512917 ;
  circC_check( 14, 14 ) =    0.231097918395994 ;
  circC_check( 15, 14 ) =    0.267570088225568 ;

  circC_check(  0, 15 ) =   -0.169502524710522 ;
  circC_check(  1, 15 ) =    0.310272290281873 ;
  circC_check(  2, 15 ) =    0.297504919764693 ;
  circC_check(  3, 15 ) =   -0.191025712185045 ;
  circC_check(  4, 15 ) =    0.352667734613656 ;
  circC_check(  5, 15 ) =   -0.025009377490697 ;
  circC_check(  6, 15 ) =   -0.321485188311959 ;
  circC_check(  7, 15 ) =   -0.147130125045907 ;
  circC_check(  8, 15 ) =    0.211591855723580 ;
  circC_check(  9, 15 ) =    0.283247041628773 ;
  circC_check( 10, 15 ) =   -0.049893457330116 ;
  circC_check( 11, 15 ) =   -0.350015203834987 ;
  circC_check( 12, 15 ) =    0.124020599512917 ;
  circC_check( 13, 15 ) =   -0.331087436935406 ;
  circC_check( 14, 15 ) =   -0.267570088225568 ;
  circC_check( 15, 15 ) =    0.231097918395994 ;

  test_qpixl_frqi_check_matrix( circC.matrix() , circC_check  , 10*eps );
}